

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * __thiscall ot::commissioner::CborMap::Init(Error *__return_storage_ptr__,CborMap *this)

{
  cn_cbor *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  anon_class_1_0_00000001 local_f2;
  v10 local_f1;
  v10 *local_f0;
  size_t local_e8;
  string local_e0;
  undefined1 local_b9;
  CborMap *pCStack_b8;
  bool condition;
  CborMap *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_b9 = (this->super_CborValue).mCbor == (cn_cbor *)0x0;
  pCStack_b8 = this;
  this_local = (CborMap *)__return_storage_ptr__;
  if (!(bool)local_b9) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cbor.cpp"
                  ,99,"virtual Error ot::commissioner::CborMap::Init()");
  }
  (this->super_CborValue).mIsRoot = true;
  pcVar1 = cn_cbor_map_create((cn_cbor_errback *)0x0);
  (this->super_CborValue).mCbor = pcVar1;
  if ((this->super_CborValue).mCbor == (cn_cbor *)0x0) {
    Init::anon_class_1_0_00000001::operator()(&local_f2);
    local_58 = &local_f0;
    local_60 = &local_f1;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_e8 = bVar2.size_;
    local_f0 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_78 = local_f0;
    sStack_70 = local_e8;
    local_50 = &local_78;
    local_88 = local_f0;
    local_80 = local_e8;
    local_68 = &local_e0;
    local_48 = local_88;
    sStack_40 = local_80;
    local_a8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = local_a8;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_e0,local_88,fmt,args);
    Error::Error(__return_storage_ptr__,kOutOfMemory,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Init(void)
{
    ASSERT(mCbor == nullptr);
    mIsRoot = true;
    mCbor   = cn_cbor_map_create(nullptr);
    return mCbor ? ERROR_NONE : ERROR_OUT_OF_MEMORY("create CBOR map");
}